

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorTarget.cxx
# Opt level: O2

string * __thiscall
cmGeneratorTarget::GetMacContentDirectory
          (string *__return_storage_ptr__,cmGeneratorTarget *this,string *config,
          ArtifactType artifact)

{
  bool bVar1;
  string local_a0;
  cmAlphaNum local_80;
  cmAlphaNum local_50;
  
  GetDirectory(&local_a0,this,config,artifact);
  local_80.View_._M_len = local_a0._M_string_length;
  local_80.View_._M_str = local_a0._M_dataplus._M_p;
  local_50.View_._M_str = local_50.Digits_;
  local_50.View_._M_len = 1;
  local_50.Digits_[0] = '/';
  cmStrCat<>(__return_storage_ptr__,&local_80,&local_50);
  std::__cxx11::string::~string((string *)&local_a0);
  bVar1 = IsFrameworkOnApple(this);
  BuildBundleDirectory((string *)&local_80,this,__return_storage_ptr__,config,bVar1 + ContentLevel);
  std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&local_80);
  std::__cxx11::string::~string((string *)&local_80);
  return __return_storage_ptr__;
}

Assistant:

std::string cmGeneratorTarget::GetMacContentDirectory(
  const std::string& config, cmStateEnums::ArtifactType artifact) const
{
  // Start with the output directory for the target.
  std::string fpath = cmStrCat(this->GetDirectory(config, artifact), '/');
  BundleDirectoryLevel level = ContentLevel;
  if (this->IsFrameworkOnApple()) {
    // additional files with a framework go into the version specific
    // directory
    level = FullLevel;
  }
  fpath = this->BuildBundleDirectory(fpath, config, level);
  return fpath;
}